

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

function<void_(TcpSocket_*,_void_*)> * __thiscall
TcpSocketImpl::BindFuncConEstablished
          (function<void_(TcpSocket_*,_void_*)> *__return_storage_ptr__,TcpSocketImpl *this,
          function<void_(TcpSocket_*,_void_*)> *fClientConnected)

{
  function<void_(TcpSocket_*,_void_*)> *fClientConnected_local;
  TcpSocketImpl *this_local;
  
  std::function<void_(TcpSocket_*,_void_*)>::swap(&this->m_fClientConnectedParam,fClientConnected);
  std::function<void_(TcpSocket_*,_void_*)>::function(__return_storage_ptr__,fClientConnected);
  return __return_storage_ptr__;
}

Assistant:

function<void(TcpSocket*, void*)> TcpSocketImpl::BindFuncConEstablished(function<void(TcpSocket*, void*)> fClientConnected) noexcept
{
    m_fClientConnectedParam.swap(fClientConnected);
    return fClientConnected;
}